

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.h
# Opt level: O0

future<void> __thiscall
Threadpool::post_task<std::function<void()>>(Threadpool *this,function<void_()> *f)

{
  bool bVar1;
  runtime_error *this_00;
  function<void_()> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  future<void> fVar2;
  shared_ptr<std::packaged_task<void_()>_> local_90;
  lock_guard<std::mutex> local_80;
  lock_guard<std::mutex> lock;
  future<void> res;
  shared_ptr<std::packaged_task<void_()>_> task;
  function<void_()> *f_local;
  Threadpool *this_local;
  
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)(f + 6));
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"post_task on Threadpool has been stopped.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::bind<std::function<void()>>
            ((type *)&res.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,in_RDX);
  std::make_shared<std::packaged_task<void()>,std::_Bind<std::function<void()>()>>
            ((_Bind<std::function<void_()>_()> *)&stack0xffffffffffffffc0);
  std::_Bind<std::function<void_()>_()>::~_Bind
            ((_Bind<std::function<void_()>_()> *)
             &res.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_ptr_access<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&stack0xffffffffffffffc0);
  std::packaged_task<void_()>::get_future((packaged_task<void_()> *)&lock);
  std::lock_guard<std::mutex>::lock_guard
            (&local_80,(mutex_type *)((long)&f[3].super__Function_base._M_functor + 8));
  std::shared_ptr<std::packaged_task<void_()>_>::shared_ptr
            (&local_90,(shared_ptr<std::packaged_task<void_()>_> *)&stack0xffffffffffffffc0);
  std::
  queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
  ::emplace<Threadpool::post_task<std::function<void()>>(std::function<void()>&&)::_lambda()_1_>
            ((queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
              *)&f->_M_invoker,(anon_class_16_1_8991e283 *)&local_90);
  post_task<std::function<void()>>(std::function<void()>&&)::{lambda()#1}::~post_task
            ((_lambda___1_ *)&local_90);
  std::lock_guard<std::mutex>::~lock_guard(&local_80);
  std::condition_variable::notify_one();
  std::future<void>::future((future<void> *)this,(future<void> *)&lock);
  std::future<void>::~future((future<void> *)&lock);
  std::shared_ptr<std::packaged_task<void_()>_>::~shared_ptr
            ((shared_ptr<std::packaged_task<void_()>_> *)&stack0xffffffffffffffc0);
  fVar2.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  fVar2.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (future<void>)
         fVar2.super___basic_future<void>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

decltype(auto) post_task(F&& f, Args&&... args)
	{
		if (!tp_run)
			throw runtime_error("post_task on Threadpool has been stopped.");

		using return_type = typename std::result_of_t<F(Args...)>;
		auto task = make_shared<packaged_task<return_type()>>(
			bind(forward<F>(f), forward<Args>(args)...)
		);
		future<return_type> res = task->get_future();
		{
			lock_guard<mutex> lock{ tp_lock };
			tp_tasks.emplace([task](){
				(*task)();
			});
		}
#ifdef THREADPOOL_AUTO_GROW
		if (tp_idl_tnum < 1 && tp_pool.size() < THREADPOOL_MAX_NUM)
			add_thread(1);
#endif
		tp_task_cv.notify_one(); 

		return res;
	}